

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSvd2x2.h
# Opt level: O1

void Eigen::internal::real_2x2_jacobi_svd<Eigen::Matrix<float,3,3,0,3,3>,float,long>
               (Matrix<float,_3,_3,_0,_3,_3> *matrix,long p,long q,JacobiRotation<float> *j_left,
               JacobiRotation<float> *j_right)

{
  float fVar1;
  JacobiRotation<float> JVar2;
  Index i;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *pCVar3;
  long lVar4;
  float fVar5;
  float c;
  float fVar6;
  float s;
  float fVar7;
  Matrix<float,_2,_2,_0,_2,_2> m;
  Matrix<float,_2,_2,_0,_2,_2> local_78;
  float local_64;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> local_60;
  float local_40;
  float local_3c;
  undefined1 local_38 [16];
  
  local_78.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] =
       (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [p * 4];
  local_60.m_xpr = &local_78;
  local_60.m_row = 0;
  local_60.m_col = 1;
  local_60.m_currentBlockRows = 1;
  local_64 = (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[q * 3 + p];
  pCVar3 = CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(&local_60,&local_64);
  local_3c = (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[p * 3 + q];
  pCVar3 = CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(pCVar3,&local_3c);
  local_40 = (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[q * 4];
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(pCVar3,&local_40);
  if ((local_60.m_currentBlockRows + local_60.m_row == 2) && (local_60.m_col == 2)) {
    if (1.1754944e-38 <=
        ABS(local_78.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[1] -
            local_78.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[2])) {
      fVar6 = (local_78.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data
               .array[3] +
              local_78.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
              array[0]) /
              (local_78.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data
               .array[1] -
              local_78.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
              array[2]);
      fVar5 = fVar6 * fVar6 + 1.0;
      if (fVar5 < 0.0) {
        fVar5 = sqrtf(fVar5);
      }
      else {
        fVar5 = SQRT(fVar5);
      }
      fVar7 = 1.0 / fVar5;
      fVar6 = fVar6 / fVar5;
    }
    else {
      fVar7 = 0.0;
      fVar6 = 1.0;
    }
    if ((((fVar6 != 1.0) || (NAN(fVar6))) || (fVar7 != 0.0)) || (NAN(fVar7))) {
      lVar4 = 0;
      do {
        fVar5 = local_78.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.
                m_data.array[lVar4 * 2];
        fVar1 = local_78.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.
                m_data.array[lVar4 * 2U + 1];
        local_78.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
        [lVar4 * 2] = fVar6 * fVar5 + fVar7 * fVar1;
        local_78.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
        [lVar4 * 2U + 1] = fVar5 * -fVar7 + fVar1 * fVar6;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 2);
    }
    local_60.m_xpr =
         (Matrix<float,_2,_2,_0,_2,_2> *)
         CONCAT44(local_60.m_xpr._4_4_,
                  local_78.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.
                  m_data.array[0]);
    local_64 = local_78.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data
               .array[3];
    local_38 = ZEXT416((uint)fVar7);
    JacobiRotation<float>::makeJacobi
              (j_right,(RealScalar *)&local_60,
               local_78.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data
               .array + 2,&local_64);
    JVar2.m_s = (float)local_38._0_4_ * j_right->m_c - fVar6 * j_right->m_s;
    JVar2.m_c = fVar6 * j_right->m_c + (float)local_38._0_4_ * j_right->m_s;
    *j_left = JVar2;
    return;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CommaInitializer.h"
                ,0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 2, 2>>::finished() [MatrixType = Eigen::Matrix<float, 2, 2>]"
               );
}

Assistant:

void real_2x2_jacobi_svd(const MatrixType& matrix, Index p, Index q,
                         JacobiRotation<RealScalar> *j_left,
                         JacobiRotation<RealScalar> *j_right)
{
  using std::sqrt;
  using std::abs;
  Matrix<RealScalar,2,2> m;
  m << numext::real(matrix.coeff(p,p)), numext::real(matrix.coeff(p,q)),
       numext::real(matrix.coeff(q,p)), numext::real(matrix.coeff(q,q));
  JacobiRotation<RealScalar> rot1;
  RealScalar t = m.coeff(0,0) + m.coeff(1,1);
  RealScalar d = m.coeff(1,0) - m.coeff(0,1);

  if(abs(d) < (std::numeric_limits<RealScalar>::min)())
  {
    rot1.s() = RealScalar(0);
    rot1.c() = RealScalar(1);
  }
  else
  {
    // If d!=0, then t/d cannot overflow because the magnitude of the
    // entries forming d are not too small compared to the ones forming t.
    RealScalar u = t / d;
    RealScalar tmp = sqrt(RealScalar(1) + numext::abs2(u));
    rot1.s() = RealScalar(1) / tmp;
    rot1.c() = u / tmp;
  }
  m.applyOnTheLeft(0,1,rot1);
  j_right->makeJacobi(m,0,1);
  *j_left = rot1 * j_right->transpose();
}